

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::attachmentQueryEmptyFboTest(TestContext *testCtx,Context *ctx)

{
  undefined8 in_RAX;
  long lVar1;
  GLint unused;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  lVar1 = 0;
  do {
    checkFboAttachmentParam
              (testCtx,ctx,*(GLenum *)((long)validTex2DAttachmentsTest::attachmentPoints + lVar1),
               0x8cd0,0);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  checkFboAttachmentParam(testCtx,ctx,0x8ce0,0x8cd1,0);
  uStack_28 = CONCAT44(0xffffffff,(undefined4)uStack_28);
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd2,(long)&uStack_28 + 4);
  checkError(testCtx,ctx,0x502);
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd3,(long)&uStack_28 + 4);
  checkError(testCtx,ctx,0x502);
  return;
}

Assistant:

static void attachmentQueryEmptyFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	static const GLenum attachmentPoints[] =
	{
		GL_COLOR_ATTACHMENT0,
		GL_DEPTH_ATTACHMENT,
		GL_STENCIL_ATTACHMENT
	};

	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(attachmentPoints); ndx++)
		checkFboAttachmentParam(testCtx, ctx, attachmentPoints[ndx], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);

	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 0);

	// Check that proper error codes are returned
	GLint unused = -1;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkError(testCtx, ctx, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkError(testCtx, ctx, GL_INVALID_OPERATION);
}